

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O2

int rcholu(double *A,int N,int stride,double *U22)

{
  int iVar1;
  long lVar2;
  double *pdVar3;
  long lVar4;
  double *pdVar5;
  long lVar6;
  long lVar7;
  double *pdVar8;
  double dVar9;
  
  lVar6 = (long)N;
  lVar7 = lVar6 * 8;
  pdVar5 = A + (stride + 1);
  while( true ) {
    dVar9 = *A;
    if (lVar6 == 1) {
      iVar1 = -1;
      if (0.0 < dVar9) {
        if (dVar9 < 0.0) {
          dVar9 = sqrt(dVar9);
        }
        else {
          dVar9 = SQRT(dVar9);
        }
        *A = dVar9;
        iVar1 = 0;
      }
      return iVar1;
    }
    if (dVar9 < 0.0) break;
    if (dVar9 < 0.0) {
      dVar9 = sqrt(dVar9);
    }
    else {
      dVar9 = SQRT(dVar9);
    }
    *A = dVar9;
    for (lVar2 = 1; lVar2 < lVar6; lVar2 = lVar2 + 1) {
      A[lVar2] = A[lVar2] / dVar9;
    }
    lVar6 = lVar6 + -1;
    mmult(A + 1,A + 1,U22,(int)lVar6,1,(int)lVar6);
    pdVar3 = pdVar5;
    pdVar8 = U22;
    for (lVar2 = 0; lVar2 < lVar6; lVar2 = lVar2 + 1) {
      for (lVar4 = 0; lVar2 + lVar4 < lVar6; lVar4 = lVar4 + 1) {
        pdVar3[lVar4] = pdVar3[lVar4] - pdVar8[lVar4];
      }
      pdVar8 = (double *)((long)pdVar8 + lVar7);
      pdVar3 = pdVar3 + (long)stride + 1;
    }
    A = A + (long)stride + 1;
    lVar7 = lVar7 + -8;
    pdVar5 = pdVar5 + (long)stride + 1;
  }
  return -1;
}

Assistant:

static int rcholu(double *A,int N, int stride, double *U22) {
	int sc;
	int j,i,u,w;
	double u11;
	
	if (N == 1) {
		if (A[0] > 0) {
			A[0] = sqrt(A[0]);
			return 0;
		} else {
			return -1;
		}
	} else {
		if (A[0] < 0) {
			return -1;
		}
		u11 = sqrt(A[0]);
		A[0] = u11;
		for (j = 1; j < N;++j) {
			A[j] /= u11;
		}
		mmult(A+1,A+1,U22,N-1,1,N-1);
		for (i = 0; i < N-1; ++i) {
			u = stride + 1+ i * stride;
			w = i * (N-1);
			for(j = i; j < N-1;j++) {
				A[j + u] -= U22[j + w];
			}
		}
		
		sc = rcholu(A+stride+1,N-1,stride,U22);
		if (sc == -1) {
			return -1;
		}
		
	}
	
	return sc;
	
}